

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUISpriteBank::draw2DSpriteBatch
          (CGUISpriteBank *this,array<unsigned_int> *indices,array<irr::core::vector2d<int>_> *pos,
          rect<int> *clip,SColor *color,u32 starttime,u32 currenttime,bool loop,bool center)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  pointer prVar4;
  IVideoDriver *pIVar5;
  CGUISpriteBank *this_00;
  bool bVar6;
  int iVar7;
  u32 uVar8;
  ulong uVar9;
  dimension2d<int> dVar10;
  undefined4 extraout_var;
  u32 i_1;
  position2di *element;
  long lVar11;
  pointer this_01;
  ulong uVar12;
  rect<int> *this_02;
  u32 i;
  u32 frame;
  ulong local_c8;
  CGUISpriteBank *local_c0;
  array<irr::core::vector2d<int>_> *local_b8;
  array<irr::gui::CGUISpriteBank::SDrawBatch> drawBatches;
  position2di p;
  
  uVar9 = (ulong)((long)(indices->m_data).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(indices->m_data).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar12 = (ulong)((long)(pos->m_data).
                         super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pos->m_data).
                        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((uint)uVar9 < (uint)uVar12) {
    uVar12 = uVar9;
  }
  local_b8 = pos;
  iVar7 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])();
  if (iVar7 != 0) {
    local_c8 = CONCAT44(local_c8._4_4_,starttime);
    local_c0 = this;
    uVar8 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])(this);
    core::array<irr::gui::CGUISpriteBank::SDrawBatch>::array(&drawBatches,uVar8);
    lVar11 = 0;
    for (uVar9 = 0; this_00 = local_c0,
        uVar9 < ((ulong)((long)(local_c0->Textures).m_data.
                               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_c0->Textures).m_data.
                              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
        uVar9 = uVar9 + 1) {
      p.X = 0;
      p.Y = 0;
      core::array<irr::gui::CGUISpriteBank::SDrawBatch>::push_back(&drawBatches,(SDrawBatch *)&p);
      SDrawBatch::~SDrawBatch((SDrawBatch *)&p);
      core::array<irr::core::vector2d<int>_>::reallocate
                ((array<irr::core::vector2d<int>_> *)
                 ((long)&((drawBatches.m_data.
                           super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                           ._M_impl.super__Vector_impl_data._M_start)->positions).m_data.
                         super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11),(u32)uVar12,true);
      core::array<irr::core::rect<int>_>::reallocate
                ((array<irr::core::rect<int>_> *)
                 ((long)&((drawBatches.m_data.
                           super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                           ._M_impl.super__Vector_impl_data._M_start)->sourceRects).m_data.
                         super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11),(u32)uVar12,true);
      lVar11 = lVar11 + 0x48;
    }
    uVar8 = currenttime - (int)local_c8;
    lVar11 = 0;
    local_c8 = uVar12 & 0xffffffff;
    for (uVar9 = 0; local_c8 != uVar9; uVar9 = uVar9 + 1) {
      uVar1 = (indices->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar9];
      frame = 0;
      bVar6 = getFrameNr(this_00,&frame,uVar1,uVar8,loop);
      if (!bVar6) goto LAB_0023aabc;
      lVar3 = *(long *)(*(long *)&(this_00->super_IGUISpriteBank).field_0x8 + (ulong)uVar1 * 0x28);
      uVar1 = *(uint *)(lVar3 + (ulong)frame * 8);
      if (uVar1 < (uint)(((long)drawBatches.m_data.
                                super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)drawBatches.m_data.
                               super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x48)) {
        uVar2 = *(uint *)(lVar3 + 4 + (ulong)frame * 8);
        prVar4 = (this_00->Rectangles).m_data.
                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((uint)((ulong)((long)(this_00->Rectangles).m_data.
                                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)prVar4) >> 4) <=
            uVar2) goto LAB_0023aabc;
        this_01 = drawBatches.m_data.
                  super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar1;
        this_02 = prVar4 + uVar2;
        if (center) {
          p = (local_b8->m_data).
              super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9];
          dVar10 = core::rect<int>::getSize(this_02);
          p.Y = p.Y + (int)((long)((ulong)(uint)(dVar10.Height >> 0x1f) << 0x20 |
                                  (ulong)dVar10 >> 0x20) / -2);
          p.X = p.X + (int)((long)((ulong)(uint)(dVar10.Width >> 0x1f) << 0x20 |
                                  (ulong)dVar10 & 0xffffffff) / -2);
          element = &p;
        }
        else {
          element = (position2di *)
                    ((long)&((local_b8->m_data).
                             super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->X + lVar11);
        }
        core::array<irr::core::vector2d<int>_>::push_back(&this_01->positions,element);
        core::array<irr::core::rect<int>_>::push_back(&this_01->sourceRects,this_02);
      }
      lVar11 = lVar11 + 8;
    }
    lVar11 = 0x20;
    uVar12 = 0;
    while( true ) {
      if ((((long)drawBatches.m_data.
                  super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)drawBatches.m_data.
                 super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x48 & 0xffffffffU) <= uVar12) break;
      if ((*(long *)((long)drawBatches.m_data.
                           super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x20) !=
           *(long *)((long)drawBatches.m_data.
                           super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x18)) &&
         (*(long *)((long)&((drawBatches.m_data.
                             super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                             ._M_impl.super__Vector_impl_data._M_start)->positions).m_data.
                           super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11) !=
          *(long *)((long)&((drawBatches.m_data.
                             super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                             ._M_impl.super__Vector_impl_data._M_start)->positions).m_data.
                           super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + lVar11))) {
        pIVar5 = local_c0->Driver;
        iVar7 = (*(local_c0->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                          (local_c0,uVar12 & 0xffffffff,
                           ((long)drawBatches.m_data.
                                  super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)drawBatches.m_data.
                                 super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                                 ._M_impl.super__Vector_impl_data._M_start) % 0x48);
        (*pIVar5->_vptr_IVideoDriver[0x31])
                  (pIVar5,CONCAT44(extraout_var,iVar7),
                   (long)drawBatches.m_data.
                         super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11 + -0x20,
                   (long)&((drawBatches.m_data.
                            super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                            ._M_impl.super__Vector_impl_data._M_start)->positions).m_data.
                          super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar11,clip,
                   (ulong)color->color,1);
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x48;
    }
LAB_0023aabc:
    ::std::
    vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ::~vector(&drawBatches.m_data);
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSpriteBatch(const core::array<u32> &indices,
		const core::array<core::position2di> &pos,
		const core::rect<s32> *clip,
		const video::SColor &color,
		u32 starttime, u32 currenttime,
		bool loop, bool center)
{
	const irr::u32 drawCount = core::min_<u32>(indices.size(), pos.size());

	if (!getTextureCount())
		return;
	core::array<SDrawBatch> drawBatches(getTextureCount());
	for (u32 i = 0; i < Textures.size(); ++i) {
		drawBatches.push_back(SDrawBatch());
		drawBatches[i].positions.reallocate(drawCount);
		drawBatches[i].sourceRects.reallocate(drawCount);
	}

	for (u32 i = 0; i < drawCount; ++i) {
		const u32 index = indices[i];

		// work out frame number
		u32 frame = 0;
		if (!getFrameNr(frame, index, currenttime - starttime, loop))
			return;

		const u32 texNum = Sprites[index].Frames[frame].textureNumber;
		if (texNum >= drawBatches.size()) {
			continue;
		}
		SDrawBatch &currentBatch = drawBatches[texNum];

		const u32 rn = Sprites[index].Frames[frame].rectNumber;
		if (rn >= Rectangles.size())
			return;

		const core::rect<s32> &r = Rectangles[rn];

		if (center) {
			core::position2di p = pos[i];
			p -= r.getSize() / 2;

			currentBatch.positions.push_back(p);
			currentBatch.sourceRects.push_back(r);
		} else {
			currentBatch.positions.push_back(pos[i]);
			currentBatch.sourceRects.push_back(r);
		}
	}

	for (u32 i = 0; i < drawBatches.size(); i++) {
		if (!drawBatches[i].positions.empty() && !drawBatches[i].sourceRects.empty())
			Driver->draw2DImageBatch(getTexture(i), drawBatches[i].positions,
					drawBatches[i].sourceRects, clip, color, true);
	}
}